

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriter::WriteLinkingSection(BinaryWriter *this)

{
  Stream *pSVar1;
  bool bVar2;
  size_type sVar3;
  const_reference ppFVar4;
  const_reference ppGVar5;
  int value;
  PrintChars in_R9D;
  string_view s;
  string_view s_00;
  string_view local_58;
  string_view local_48;
  bool local_31;
  reference pSStack_30;
  bool is_defined;
  Symbol *sym;
  iterator __end3;
  iterator __begin3;
  vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  *__range3;
  BinaryWriter *this_local;
  
  BeginCustomSection(this,"linking");
  WriteU32Leb128<int>(this->stream_,1,"metadata version");
  sVar3 = std::
          vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
          ::size(&this->symbols_);
  if (sVar3 != 0) {
    Stream::WriteU8Enum<wabt::LinkingEntryType>(this->stream_,SymbolTable,"symbol table",No);
    BeginSubsection(this,"symbol table");
    pSVar1 = this->stream_;
    sVar3 = std::
            vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
            ::size(&this->symbols_);
    WriteU32Leb128<unsigned_long>(pSVar1,sVar3,"num symbols");
    __end3 = std::
             vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
             ::begin(&this->symbols_);
    sym = (Symbol *)
          std::
          vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
          ::end(&this->symbols_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wabt::(anonymous_namespace)::Symbol_*,_std::vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>_>
                                       *)&sym), bVar2) {
      pSStack_30 = __gnu_cxx::
                   __normal_iterator<wabt::(anonymous_namespace)::Symbol_*,_std::vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>_>
                   ::operator*(&__end3);
      local_31 = true;
      if (pSStack_30->type == Function) {
        local_31 = this->module_->num_func_imports <= pSStack_30->element_index;
      }
      if ((pSStack_30->type == Global) &&
         (pSStack_30->element_index < this->module_->num_global_imports)) {
        local_31 = false;
      }
      Stream::WriteU8Enum<wabt::SymbolType>(this->stream_,pSStack_30->type,"symbol type",No);
      value = 0x10;
      if ((local_31 & 1U) != 0) {
        value = 0;
      }
      WriteU32Leb128<int>(this->stream_,value,"symbol flags");
      WriteU32Leb128(this->stream_,pSStack_30->element_index,"element index");
      if ((local_31 & 1U) != 0) {
        if (pSStack_30->type == Function) {
          pSVar1 = this->stream_;
          ppFVar4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                              (&this->module_->funcs,(ulong)pSStack_30->element_index);
          string_view::string_view(&local_48,&(*ppFVar4)->name);
          s.size_ = (size_type)"function name";
          s.data_ = (char *)local_48.size_;
          WriteStr((wabt *)pSVar1,(Stream *)local_48.data_,s,&DAT_00000001,in_R9D);
        }
        else if (pSStack_30->type == Global) {
          pSVar1 = this->stream_;
          ppGVar5 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                              (&this->module_->globals,(ulong)pSStack_30->element_index);
          string_view::string_view(&local_58,&(*ppGVar5)->name);
          s_00.size_ = (size_type)"global name";
          s_00.data_ = (char *)local_58.size_;
          WriteStr((wabt *)pSVar1,(Stream *)local_58.data_,s_00,&DAT_00000001,in_R9D);
        }
      }
      __gnu_cxx::
      __normal_iterator<wabt::(anonymous_namespace)::Symbol_*,_std::vector<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>_>
      ::operator++(&__end3);
    }
    EndSubsection(this);
  }
  EndSection(this);
  return;
}

Assistant:

void BinaryWriter::WriteLinkingSection() {
  BeginCustomSection(WABT_BINARY_SECTION_LINKING);
  WriteU32Leb128(stream_, 1, "metadata version");
  if (symbols_.size()) {
    stream_->WriteU8Enum(LinkingEntryType::SymbolTable, "symbol table");
    BeginSubsection("symbol table");
    WriteU32Leb128(stream_, symbols_.size(), "num symbols");

    for (const Symbol& sym : symbols_) {
      bool is_defined = true;
      if (sym.type == SymbolType::Function) {
        if (sym.element_index < module_->num_func_imports) {
          is_defined = false;
        }
      }
      if (sym.type == SymbolType::Global) {
        if (sym.element_index < module_->num_global_imports) {
          is_defined = false;
        }
      }
      stream_->WriteU8Enum(sym.type, "symbol type");
      WriteU32Leb128(stream_, is_defined ? 0 : WABT_SYMBOL_FLAG_UNDEFINED,
                     "symbol flags");
      WriteU32Leb128(stream_, sym.element_index, "element index");
      if (is_defined) {
        if (sym.type == SymbolType::Function) {
          WriteStr(stream_, module_->funcs[sym.element_index]->name,
                   "function name", PrintChars::Yes);
        } else if (sym.type == SymbolType::Global) {
          WriteStr(stream_, module_->globals[sym.element_index]->name,
                   "global name", PrintChars::Yes);
        }
      }
    }
    EndSubsection();
  }
  EndSection();
}